

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O1

PixelStyle SSD1306::oppositeStyle(PixelStyle style)

{
  PixelStyle PVar1;
  
  PVar1 = None;
  if (style < 4) {
    PVar1 = *(PixelStyle *)(&DAT_00109334 + (ulong)style * 4);
  }
  return PVar1;
}

Assistant:

SSD1306::PixelStyle
SSD1306::oppositeStyle(
    PixelStyle style)
{
    PixelStyle opposite{PixelStyle::None};

    switch (style)
    {
    case PixelStyle::Set:

        opposite = PixelStyle::Unset;
        break;

    case PixelStyle::Unset:

        opposite = PixelStyle::Set;
        break;

    case PixelStyle::Xor:

        opposite = PixelStyle::Xor;
        break;

    case PixelStyle::None:

        opposite = PixelStyle::Xor;
        break;
    }

    return opposite;
}